

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::_::concat<kj::ArrayPtr<char_const>,kj::String>
          (String *__return_storage_ptr__,_ *this,ArrayPtr<const_char> *params,String *params_1)

{
  size_t __n;
  char *__src;
  char *pcVar1;
  long lVar2;
  char *__dest;
  
  lVar2 = 0;
  if (params->size_ != 0) {
    lVar2 = params->size_ - 1;
  }
  heapString(__return_storage_ptr__,lVar2 + *(long *)(this + 8));
  __dest = (char *)(__return_storage_ptr__->content).size_;
  if (__dest != (char *)0x0) {
    __dest = (__return_storage_ptr__->content).ptr;
  }
  __n = *(size_t *)(this + 8);
  if (__n != 0) {
    memcpy(__dest,*(void **)this,__n);
    __dest = __dest + __n;
  }
  __src = params->ptr;
  pcVar1 = __src + (params->size_ - 1);
  if (params->size_ == 0) {
    pcVar1 = (char *)0x0;
    __src = (char *)0x0;
  }
  if (__src != pcVar1) {
    memcpy(__dest,__src,(long)pcVar1 - (long)__src);
  }
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}